

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void lexer_Init(void)

{
  char *local_28;
  char *ptr;
  ulong uStack_18;
  uint16_t nodeID;
  size_t i;
  uint16_t usedNodes;
  
  i._6_2_ = 1;
  uStack_18 = 0;
  do {
    if (0x9f < uStack_18) {
      return;
    }
    ptr._6_2_ = 0;
    for (local_28 = keywords[uStack_18].name; *local_28 != '\0'; local_28 = local_28 + 1) {
      if (keywordDict[ptr._6_2_].children[*local_28 + -0x20] == 0) {
        if (0x178 < i._6_2_) {
          __assert_fail("usedNodes < sizeof(keywordDict) / sizeof(*keywordDict)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                        ,0x259,"lexer_Init");
        }
        keywordDict[ptr._6_2_].children[*local_28 + -0x20] = i._6_2_;
        i._6_2_ = i._6_2_ + 1;
      }
      ptr._6_2_ = keywordDict[ptr._6_2_].children[*local_28 + -0x20];
    }
    keywordDict[ptr._6_2_].keyword = keywords + uStack_18;
    uStack_18 = uStack_18 + 1;
  } while( true );
}

Assistant:

void lexer_Init(void)
{
	// Build the dictionary of keywords. This could be done at compile time instead, however:
	// - Doing so manually is a task nobody wants to undertake
	// - It would be massively hard to read
	// - Doing it within CC or CPP would be quite non-trivial
	// - Doing it externally would require some extra work to use only POSIX tools
	// - The startup overhead isn't much compared to the program's
	uint16_t usedNodes = 1;

	for (size_t i = 0; i < ARRAY_SIZE(keywords); i++) {
		uint16_t nodeID = 0;

		// Walk the dictionary, creating intermediate nodes for the keyword
		for (char const *ptr = keywords[i].name; *ptr; ptr++) {
			// We should be able to assume all entries are well-formed
			if (keywordDict[nodeID].children[*ptr - ' '] == 0) {
				// If this gets tripped up, set the size of keywordDict to
				// something high, compile with `-DPRINT_NODE_COUNT` (see below),
				// and set the size to that.
				assert(usedNodes < sizeof(keywordDict) / sizeof(*keywordDict));

				// There is no node at that location, grab one from the pool
				keywordDict[nodeID].children[*ptr - ' '] = usedNodes;
				usedNodes++;
			}
			nodeID = keywordDict[nodeID].children[*ptr - ' '];
		}

		// This assumes that no two keywords have the same name
		keywordDict[nodeID].keyword = &keywords[i];
	}

#ifdef PRINT_NODE_COUNT // For the maintainer to check how many nodes are needed
	printf("Lexer keyword dictionary: %zu keywords in %u nodes (pool size %zu)\n",
	       ARRAY_SIZE(keywords), usedNodes, ARRAY_SIZE(keywordDict));
#endif
}